

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

Expression * __thiscall
wasm::
Walker<wasm::(anonymous_namespace)::SegmentRemover,_wasm::Visitor<wasm::(anonymous_namespace)::SegmentRemover,_void>_>
::replaceCurrent(Walker<wasm::(anonymous_namespace)::SegmentRemover,_wasm::Visitor<wasm::(anonymous_namespace)::SegmentRemover,_void>_>
                 *this,Expression *expression)

{
  BinaryLocation BVar1;
  BinaryLocation BVar2;
  bool bVar3;
  unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
  *this_00;
  pointer ppVar4;
  mapped_type *pmVar5;
  DebugLocation location;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
  local_30;
  iterator iter;
  Expression *curr;
  unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
  *debugLocations;
  Expression *expression_local;
  Walker<wasm::(anonymous_namespace)::SegmentRemover,_wasm::Visitor<wasm::(anonymous_namespace)::SegmentRemover,_void>_>
  *this_local;
  
  debugLocations =
       (unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
        *)expression;
  if (this->currFunction != (Function *)0x0) {
    this_00 = &this->currFunction->debugLocations;
    expression_local = (Expression *)this;
    bVar3 = std::
            unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
            ::empty(this_00);
    if (!bVar3) {
      iter.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                 )getCurrent(this);
      local_30._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
           ::find(this_00,(key_type *)&iter);
      location._4_8_ =
           std::
           unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
           ::end(this_00);
      bVar3 = std::__detail::operator!=
                        (&local_30,
                         (_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                          *)&location.lineNumber);
      if (bVar3) {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false,_false>
                               *)&local_30);
        BVar1 = (ppVar4->second).fileIndex;
        BVar2 = (ppVar4->second).lineNumber;
        location.fileIndex = (ppVar4->second).columnNumber;
        std::
        unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
        ::erase(this_00,(iterator)local_30._M_cur);
        pmVar5 = std::
                 unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
                 ::operator[](this_00,(key_type *)&debugLocations);
        pmVar5->fileIndex = BVar1;
        pmVar5->lineNumber = BVar2;
        pmVar5->columnNumber = location.fileIndex;
      }
    }
  }
  *this->replacep = (Expression *)debugLocations;
  return (Expression *)debugLocations;
}

Assistant:

Expression* replaceCurrent(Expression* expression) {
    // Copy debug info, if present.
    if (currFunction) {
      auto& debugLocations = currFunction->debugLocations;
      if (!debugLocations.empty()) {
        auto* curr = getCurrent();
        auto iter = debugLocations.find(curr);
        if (iter != debugLocations.end()) {
          auto location = iter->second;
          debugLocations.erase(iter);
          debugLocations[expression] = location;
        }
      }
    }
    return *replacep = expression;
  }